

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O3

void wallet::WaitForDeleteWallet(shared_ptr<wallet::CWallet> *wallet)

{
  element_type *peVar1;
  pointer pcVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  const_iterator cVar3;
  long in_FS_OFFSET;
  UniqueLock<GlobalMutex> criticalblock13;
  string name;
  unique_lock<std::mutex> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  peVar1 = (wallet->super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pcVar2 = (peVar1->m_name)._M_dataplus._M_p;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar2,pcVar2 + (peVar1->m_name)._M_string_length);
  local_68._M_device = (mutex_type *)g_wallet_release_mutex;
  local_68._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_68);
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string_const&>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)g_unloading_wallet_set_abi_cxx11_,&local_58);
  std::unique_lock<std::mutex>::~unique_lock(&local_68);
  this = (wallet->super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
  ;
  (wallet->super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  (wallet->super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  }
  local_68._M_device = (mutex_type *)g_wallet_release_mutex;
  local_68._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_68);
  while( true ) {
    cVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)g_unloading_wallet_set_abi_cxx11_,&local_58);
    if (cVar3._M_node == (_Base_ptr)(g_unloading_wallet_set_abi_cxx11_ + 8)) break;
    std::condition_variable::wait((unique_lock *)g_wallet_release_cv);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void WaitForDeleteWallet(std::shared_ptr<CWallet>&& wallet)
{
    // Mark wallet for unloading.
    const std::string name = wallet->GetName();
    {
        LOCK(g_wallet_release_mutex);
        g_unloading_wallet_set.insert(name);
        // Do not expect to be the only one removing this wallet.
        // Multiple threads could simultaneously be waiting for deletion.
    }

    // Time to ditch our shared_ptr and wait for FlushAndDeleteWallet call.
    wallet.reset();
    {
        WAIT_LOCK(g_wallet_release_mutex, lock);
        while (g_unloading_wallet_set.count(name) == 1) {
            g_wallet_release_cv.wait(lock);
        }
    }
}